

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverLS.cpp
# Opt level: O3

void __thiscall chrono::ChIterativeSolverLS::ChIterativeSolverLS(ChIterativeSolverLS *this)

{
  ChMatrixSPMV *pCVar1;
  
  ChIterativeSolver::ChIterativeSolver(&this->super_ChIterativeSolver,-1,-1.0,true,false);
  (this->super_ChSolverLS).super_ChSolver.verbose = false;
  (this->super_ChSolverLS).super_ChSolver.output_dir._M_dataplus._M_p =
       (pointer)&(this->super_ChSolverLS).super_ChSolver.output_dir.field_2;
  (this->super_ChSolverLS).super_ChSolver.output_dir._M_string_length = 0;
  (this->super_ChSolverLS).super_ChSolver.output_dir.field_2._M_local_buf[0] = '\0';
  (this->super_ChSolverLS).super_ChSolver.frame_id._M_dataplus._M_p =
       (pointer)&(this->super_ChSolverLS).super_ChSolver.frame_id.field_2;
  (this->super_ChSolverLS).super_ChSolver.frame_id._M_string_length = 0;
  (this->super_ChSolverLS).super_ChSolver.frame_id.field_2._M_local_buf[0] = '\0';
  (this->super_ChIterativeSolver)._vptr_ChIterativeSolver =
       (_func_int **)&PTR__ChIterativeSolverLS_00b39a88;
  (this->super_ChSolverLS).super_ChSolver._vptr_ChSolver =
       (_func_int **)&PTR__ChIterativeSolverLS_00b39ae0;
  (this->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->m_invdiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->m_invdiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->m_initguess).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->m_initguess).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  pCVar1 = (ChMatrixSPMV *)::operator_new(0x20);
  pCVar1->m_N = 0;
  pCVar1->m_sysd = (ChSystemDescriptor *)0x0;
  (pCVar1->m_vect).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (pCVar1->m_vect).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  this->m_spmv = pCVar1;
  return;
}

Assistant:

ChIterativeSolverLS::ChIterativeSolverLS() : ChIterativeSolver(-1, -1.0, true, false) {
    m_spmv = new ChMatrixSPMV();
}